

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to1_int8.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  char *k00_1;
  int j_1;
  int k_1;
  int p_1;
  char *g00_1;
  char *k00;
  int j;
  int i;
  int k;
  int p;
  char *g00;
  int q;
  Mat kernel;
  int maxk;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffffa90;
  size_t in_stack_fffffffffffffa98;
  undefined8 in_stack_fffffffffffffaa0;
  undefined8 in_stack_fffffffffffffaa8;
  Mat *in_stack_fffffffffffffab0;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined4 local_4b8;
  long *local_4b0;
  undefined4 local_4a8;
  undefined4 local_4a4;
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined4 local_498;
  Allocator *in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  int iVar1;
  undefined4 in_stack_fffffffffffffb88;
  int iVar2;
  undefined4 in_stack_fffffffffffffb8c;
  int iVar3;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined4 local_458;
  long local_450;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_440;
  undefined4 local_43c;
  undefined4 local_438;
  undefined8 local_430;
  undefined1 *local_428;
  undefined8 local_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined4 local_408;
  long *local_400;
  undefined4 local_3f8;
  undefined4 local_3f4;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 local_3e8;
  undefined8 local_3e0;
  void *local_3d8;
  int local_3d0;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined4 local_3a8;
  long local_3a0;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined8 local_380;
  undefined1 *local_378;
  int local_370;
  void *local_360;
  int *local_358;
  long local_350;
  long *local_340;
  int local_334;
  int local_330;
  long local_320;
  int local_314;
  int local_308;
  int local_304;
  long *local_300;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  void **local_2d0;
  int local_2b0;
  undefined4 local_2ac;
  void **local_2a8;
  undefined8 *local_298;
  undefined8 *local_288;
  undefined8 *local_278;
  undefined8 *local_268;
  undefined1 local_25d;
  int local_25c;
  void **local_258;
  undefined8 *local_250;
  undefined1 local_22d;
  int local_22c;
  undefined8 *local_220;
  undefined1 local_1fd;
  int local_1fc;
  void **local_1f8;
  undefined8 *local_1f0;
  undefined1 local_1cd;
  int local_1cc;
  undefined8 *local_1c0;
  long local_150;
  undefined4 local_144;
  long local_140;
  undefined1 *local_138;
  undefined4 local_12c;
  int local_128;
  int local_124;
  undefined8 *local_120;
  void *local_100;
  undefined8 *local_e8;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  undefined1 *local_c8;
  undefined4 local_bc;
  int local_b8;
  int local_b4;
  undefined8 *local_b0;
  void *local_90;
  undefined8 *local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  int local_1c;
  undefined8 *local_18;
  int local_c;
  undefined8 *local_8;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
  local_314 = in_R8D * in_R9D;
  local_308 = in_ECX;
  local_304 = in_EDX;
  local_300 = in_RSI;
  Mat::reshape((Mat *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
               in_stack_fffffffffffffb84,in_stack_fffffffffffffb80,
               (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),in_stack_fffffffffffffb70);
  iVar2 = (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20);
  if (local_308 < 4) {
    Mat::create(in_stack_fffffffffffffab0,iVar2,(int)in_stack_fffffffffffffaa8,iVar3,
                in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  }
  else {
    Mat::create(in_stack_fffffffffffffab0,iVar2,(int)in_stack_fffffffffffffaa8,iVar3,
                in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  }
  for (local_370 = 0; local_370 + 3 < local_308; local_370 = local_370 + 4) {
    local_1cc = local_370 / 4;
    local_1c0 = &local_3c0;
    local_124 = *(int *)((long)local_300 + 0x2c);
    local_128 = (int)local_300[6];
    local_12c = *(undefined4 *)((long)local_300 + 0x34);
    local_138 = (undefined1 *)(*local_300 + local_300[8] * (long)local_1cc * local_300[2]);
    local_140 = local_300[2];
    local_144 = (undefined4)local_300[3];
    local_150 = local_300[4];
    local_120 = &local_3c0;
    local_38 = (long)local_124 * (long)local_128 * local_140;
    local_28 = &local_3c0;
    local_2f0 = &local_3c0;
    local_3c = 0x10;
    local_1cd = 1;
    local_3c0 = 0;
    local_3b0 = 0;
    local_3a8 = 0;
    local_398 = 0;
    local_394 = 0;
    local_390 = 0;
    local_38c = 0;
    local_388 = 0;
    local_380 = 0;
    local_3b8 = 0;
    local_378 = local_138;
    for (local_3c4 = 0; local_3c4 + 7 < local_304; local_3c4 = local_3c4 + 8) {
      for (local_3c8 = 0; local_3c8 < local_314; local_3c8 = local_3c8 + 1) {
        for (local_3cc = 0; local_3cc < 4; local_3cc = local_3cc + 1) {
          for (local_3d0 = 0; local_3d0 < 8; local_3d0 = local_3d0 + 1) {
            local_1fc = local_370 + local_3cc;
            local_1f0 = &local_420;
            local_1f8 = &local_360;
            local_100 = (void *)((long)local_360 + local_320 * local_1fc * local_350);
            local_e8 = &local_420;
            local_400 = local_340;
            local_48 = (long)local_334 * (long)local_330 * local_350;
            local_4c = 0x10;
            local_1fd = 1;
            local_c = local_3c4 + local_3d0;
            local_8 = &local_420;
            local_3d8 = (void *)((long)local_100 + (long)local_334 * (long)local_c * local_350);
            local_2e8 = &local_420;
            local_420 = 0;
            local_410 = 0;
            local_408 = 0;
            local_3f8 = 0;
            local_3f4 = 0;
            local_3f0 = 0;
            local_3ec = 0;
            local_3e8 = 0;
            local_3e0 = 0;
            local_418 = 0;
            *local_378 = *(undefined1 *)((long)local_3d8 + (long)local_3c8);
            local_378 = local_378 + 1;
            local_278 = local_2e8;
          }
        }
      }
    }
    local_268 = local_2f0;
    local_3a0 = local_150;
  }
  for (; local_370 < local_308; local_370 = local_370 + 1) {
    local_22c = local_370 / 4 + local_370 % 4;
    local_220 = &local_470;
    local_b4 = *(int *)((long)local_300 + 0x2c);
    local_b8 = (int)local_300[6];
    local_bc = *(undefined4 *)((long)local_300 + 0x34);
    local_c8 = (undefined1 *)(*local_300 + local_300[8] * (long)local_22c * local_300[2]);
    local_d0 = local_300[2];
    local_d4 = (undefined4)local_300[3];
    local_e0 = local_300[4];
    local_b0 = &local_470;
    local_58 = (long)local_b4 * (long)local_b8 * local_d0;
    local_30 = &local_470;
    local_2e0 = &local_470;
    local_5c = 0x10;
    local_22d = 1;
    local_470 = 0;
    local_460 = 0;
    local_458 = 0;
    local_448 = 0;
    local_444 = 0;
    local_440 = 0;
    local_43c = 0;
    local_438 = 0;
    local_430 = 0;
    local_468 = 0;
    local_428 = local_c8;
    for (iVar3 = 0; iVar3 + 7 < local_304; iVar3 = iVar3 + 8) {
      for (iVar2 = 0; iVar2 < local_314; iVar2 = iVar2 + 1) {
        for (iVar1 = 0; iVar1 < 8; iVar1 = iVar1 + 1) {
          local_250 = &local_4d0;
          local_258 = &local_360;
          local_25c = local_370;
          local_90 = (void *)((long)local_360 + local_320 * local_370 * local_350);
          local_78 = &local_4d0;
          local_4b0 = local_340;
          local_68 = (long)local_334 * (long)local_330 * local_350;
          local_6c = 0x10;
          local_25d = 1;
          local_1c = iVar3 + iVar1;
          local_18 = &local_4d0;
          local_2d8 = &local_4d0;
          local_4d0 = 0;
          local_4c0 = 0;
          local_4b8 = 0;
          local_4a8 = 0;
          local_4a4 = 0;
          local_4a0 = 0;
          local_49c = 0;
          local_498 = 0;
          local_4c8 = 0;
          *local_428 = *(undefined1 *)
                        ((long)local_90 + (long)iVar2 + (long)local_334 * (long)local_1c * local_350
                        );
          local_428 = local_428 + 1;
          local_298 = local_2d8;
        }
      }
    }
    local_288 = local_2e0;
    local_450 = local_e0;
  }
  local_2d0 = &local_360;
  if (local_358 != (int *)0x0) {
    local_2ac = 0xffffffff;
    LOCK();
    local_2b0 = *local_358;
    *local_358 = *local_358 + -1;
    UNLOCK();
    if (local_2b0 == 1) {
      local_2a8 = local_2d0;
      if (local_340 == (long *)0x0) {
        if (local_360 != (void *)0x0) {
          free(local_360);
        }
      }
      else {
        (**(code **)(*local_340 + 0x18))(local_340,local_360);
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 8a-4b-maxk-inch/8a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    if (outch >= 4)
        kernel_tm.create(32 * maxk, inch / 8, outch / 4 + outch % 4, (size_t)1u);
    else
        kernel_tm.create(8 * maxk, inch / 8, outch, (size_t)1u);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        signed char* g00 = kernel_tm.channel(q / 4);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const signed char* k00 = kernel.channel(q + i).row<const signed char>(p + j);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
    }
    // TODO unroll 2
    for (; q < outch; q++)
    {
        signed char* g00 = kernel_tm.channel(q / 4 + q % 4);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int j = 0; j < 8; j++)
                {
                    const signed char* k00 = kernel.channel(q).row<const signed char>(p + j);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
    }
}